

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
* MatchMultiA(optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              *__return_storage_ptr__,CScript *script)

{
  uint uVar1;
  pointer puVar2;
  opcodetype opcode_00;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  CScript *pCVar7;
  optional<int> oVar8;
  char cVar9;
  uint uVar10;
  CScript *pCVar11;
  size_t __n;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  opcodetype opcode;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  opcodetype local_64;
  const_iterator local_60;
  pointer local_58;
  pointer pSStack_50;
  pointer local_48;
  long local_38;
  const_iterator end;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (pointer)0x0;
  pSStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  uVar1 = (script->super_CScriptBase)._size;
  uVar10 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar10 = uVar1;
  }
  if (uVar10 != 0) {
    pCVar7 = script;
    if (0x1c < uVar1) {
      pCVar7 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (((pCVar7->super_CScriptBase)._union.direct[0] == ' ') &&
       ((pCVar7->super_CScriptBase)._union.direct[(int)(uVar10 - 1)] == -100)) {
      local_60.ptr = (uchar *)pCVar7;
      if ((0x21 < (int)uVar10) && ((pCVar7->super_CScriptBase)._union.direct[0] == ' ')) {
        do {
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((pCVar7->super_CScriptBase)._union.direct + 1);
          local_64 = 0x20;
          local_60.ptr = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          std::vector<Span<unsigned_char_const>,std::allocator<Span<unsigned_char_const>>>::
          emplace_back<unsigned_char_const*,int>
                    ((vector<Span<unsigned_char_const>,std::allocator<Span<unsigned_char_const>>> *)
                     &local_58,(uchar **)&local_88,(int *)&local_64);
          cVar9 = -0x46;
          if ((long)pSStack_50 - (long)local_58 == 0x10) {
            cVar9 = -0x54;
          }
          if (cVar9 != (((CScript *)(local_60.ptr + 0x20))->super_CScriptBase)._union.direct[0])
          break;
          pCVar7 = (CScript *)(local_60.ptr + 0x21);
          uVar1 = (script->super_CScriptBase)._size;
          uVar10 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar10 = uVar1;
          }
          pCVar11 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
          if (uVar1 < 0x1d) {
            pCVar11 = script;
          }
          end.ptr = (uchar *)((long)&(pCVar11->super_CScriptBase)._union + (long)(int)uVar10);
          local_60.ptr = (uchar *)pCVar7;
          if ((int)end.ptr - (int)pCVar7 < 0x22) {
            if (pSStack_50 != local_58 && (ulong)((long)pSStack_50 - (long)local_58) < 0x3e71) {
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar6 = GetScriptOp(&local_60,end,&local_64,&local_88);
              opcode_00 = local_64;
              if (bVar6) {
                uVar1 = (script->super_CScriptBase)._size;
                uVar10 = uVar1 - 0x1d;
                if (uVar1 < 0x1d) {
                  uVar10 = uVar1;
                }
                if (uVar1 >= 0x1d) {
                  script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
                }
                pCVar7 = (CScript *)((script->super_CScriptBase)._union.direct + (int)uVar10);
                if ((((CScript *)local_60.ptr == pCVar7) || (*local_60.ptr != 0x9c)) ||
                   (local_60.ptr = local_60.ptr + 1, (CScript *)local_60.ptr != pCVar7))
                goto LAB_001b8214;
                local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
                          (&local_a8,
                           (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
                puVar2 = local_a8._M_impl.super__Vector_impl_data._M_start;
                __n = (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                if (__n != 0) {
                  memmove(local_a8._M_impl.super__Vector_impl_data._M_start,
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n);
                }
                local_a8._M_impl.super__Vector_impl_data._M_finish = puVar2 + __n;
                oVar8 = GetScriptNumber(opcode_00,(valtype *)&local_a8,1,
                                        (int)((ulong)((long)pSStack_50 - (long)local_58) >> 4));
                if (local_a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a8._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a8._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a8._M_impl.super__Vector_impl_data._M_start);
                }
                pSVar5 = local_48;
                pSVar4 = pSStack_50;
                pSVar3 = local_58;
                if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int> >> 0x20 & 1) == 0) goto LAB_001b8214;
                local_58 = (pointer)0x0;
                pSStack_50 = (pointer)0x0;
                local_48 = (pointer)0x0;
                (__return_storage_ptr__->
                super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                ._M_payload._M_value.first =
                     oVar8.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload;
                *(pointer *)
                 &(__return_storage_ptr__->
                  super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                  ._M_payload._M_value.second.
                  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                  ._M_impl = pSVar3;
                *(pointer *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                         ._M_payload._M_value.second.
                         super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                 + 8) = pSVar4;
                *(pointer *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                         ._M_payload._M_value.second.
                         super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                 + 0x10) = pSVar5;
                bVar6 = true;
              }
              else {
LAB_001b8214:
                bVar6 = false;
              }
              (__return_storage_ptr__->
              super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              ._M_engaged = bVar6;
              if ((CScript *)
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (CScript *)0x0) {
                operator_delete(local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_001b80fe;
            }
            break;
          }
        } while ((pCVar7->super_CScriptBase)._union.direct[0] == ' ');
      }
      (__return_storage_ptr__->
      super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
      ._M_engaged = false;
LAB_001b80fe:
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      goto LAB_001b80d2;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
  ._M_engaged = false;
LAB_001b80d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<int, std::vector<Span<const unsigned char>>>> MatchMultiA(const CScript& script)
{
    std::vector<Span<const unsigned char>> keyspans;

    // Redundant, but very fast and selective test.
    if (script.size() == 0 || script[0] != 32 || script.back() != OP_NUMEQUAL) return {};

    // Parse keys
    auto it = script.begin();
    while (script.end() - it >= 34) {
        if (*it != 32) return {};
        ++it;
        keyspans.emplace_back(&*it, 32);
        it += 32;
        if (*it != (keyspans.size() == 1 ? OP_CHECKSIG : OP_CHECKSIGADD)) return {};
        ++it;
    }
    if (keyspans.size() == 0 || keyspans.size() > MAX_PUBKEYS_PER_MULTI_A) return {};

    // Parse threshold.
    opcodetype opcode;
    std::vector<unsigned char> data;
    if (!script.GetOp(it, opcode, data)) return {};
    if (it == script.end()) return {};
    if (*it != OP_NUMEQUAL) return {};
    ++it;
    if (it != script.end()) return {};
    auto threshold = GetScriptNumber(opcode, data, 1, (int)keyspans.size());
    if (!threshold) return {};

    // Construct result.
    return std::pair{*threshold, std::move(keyspans)};
}